

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

void __thiscall CVmImageLoader::load_entrypt(CVmImageLoader *this,ulong siz)

{
  char buf [32];
  uint32_t local_38;
  ushort local_34;
  ushort local_32;
  ushort local_30;
  ushort local_2e;
  ushort local_2c;
  ushort local_2a;
  
  if ((this->field_0x90 & 4) != 0) {
    err_throw(0x13d);
  }
  if (0xf < siz) {
    (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_38,0x10);
    this->entrypt_ = local_38;
    CVmRun::set_funchdr_size(&G_interpreter_X,(ulong)local_34);
    G_exc_entry_size_X = (size_t)local_32;
    G_line_entry_size_X = (size_t)local_30;
    G_dbg_hdr_size_X = (size_t)local_2e;
    G_dbg_lclsym_hdr_size_X = (size_t)local_2c;
    G_dbg_fmt_vsn_X = (int)local_2a;
    G_dbg_frame_size_X = 4;
    if ((siz & 0xfffffffffffffffe) != 0x10) {
      (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_38,2);
      G_dbg_frame_size_X = (int)(ushort)local_38;
    }
    this->field_0x90 = this->field_0x90 | 4;
    return;
  }
  err_throw(0x132);
}

Assistant:

void CVmImageLoader::load_entrypt(VMG_ ulong siz)
{
    char buf[32];
    
    /* if we've already loaded an entrypoint, throw an error */
    if (loaded_entrypt_)
        err_throw(VMERR_IMAGE_ENTRYPT_REDEF);

    /* read the entrypoint offset */
    read_data(buf, 16, &siz);

    /* set the entrypoint */
    entrypt_ = t3rp4u(buf);

    /* set the method header size in the interpreter */
    G_interpreter->set_funchdr_size(osrp2(buf+4));

    /* set the exception table entry size global */
    G_exc_entry_size = osrp2(buf+6);

    /* set the debugger source line record size global */
    G_line_entry_size = osrp2(buf+8);

    /* set the debug table header size */
    G_dbg_hdr_size = osrp2(buf+10);

    /* set the debug local symbol header size */
    G_dbg_lclsym_hdr_size = osrp2(buf+12);

    /* set the debug version ID */
    G_dbg_fmt_vsn = osrp2(buf+14);

    /* set the frame size */
    G_dbg_frame_size = 4;
    if (siz >= 2)
    {
        read_data(buf, 2, &siz);
        G_dbg_frame_size = osrp2(buf);
    }

    /* note that we've loaded it */
    loaded_entrypt_ = TRUE;
}